

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xMapping.c
# Opt level: O0

void TMS320C64x_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  undefined8 *puVar1;
  unsigned_short uVar2;
  uint uVar3;
  undefined4 in_EDX;
  uint *in_RSI;
  insn_map *in_RDI;
  unsigned_short i;
  undefined2 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffea;
  
  uVar2 = insn_find(in_RDI,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,
                    (unsigned_short **)
                    CONCAT44(in_EDX,CONCAT22(in_stack_ffffffffffffffea,in_stack_ffffffffffffffe8)));
  if ((uVar2 != 0) && (*in_RSI = (uint)insns[uVar2].mapid, *(int *)(in_RDI[1].regs_use + 7) != 0)) {
    puVar1 = *(undefined8 **)(in_RSI + 0x3c);
    *puVar1 = *(undefined8 *)insns[uVar2].regs_use;
    puVar1[1] = *(undefined8 *)(insns[uVar2].regs_use + 4);
    puVar1[2] = *(undefined8 *)(insns[uVar2].regs_use + 8);
    uVar3 = count_positive(insns[uVar2].regs_use);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x20) = (char)uVar3;
    memcpy((void *)(*(long *)(in_RSI + 0x3c) + 0x22),insns[uVar2].regs_mod,0x28);
    uVar3 = count_positive(insns[uVar2].regs_mod);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x4a) = (char)uVar3;
    *(undefined8 *)(*(long *)(in_RSI + 0x3c) + 0x4b) = *(undefined8 *)insns[uVar2].groups;
    uVar3 = count_positive8(insns[uVar2].groups);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) = (char)uVar3;
    if (((insns[uVar2].branch & 1U) != 0) || ((insns[uVar2].indirect_branch & 1U) != 0)) {
      *(undefined1 *)
       (*(long *)(in_RSI + 0x3c) + 0x4b + (ulong)*(byte *)(*(long *)(in_RSI + 0x3c) + 0x53)) = 1;
      *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) =
           *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) + '\x01';
    }
  }
  return;
}

Assistant:

void TMS320C64x_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	unsigned short i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive8(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				insn->detail->groups[insn->detail->groups_count] = TMS320C64X_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
		}
	}
}